

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O0

void __thiscall ON_SHA1::AccumulateDoubleArray(ON_SHA1 *this,size_t count,double *a)

{
  double *local_48;
  double *a1;
  double v;
  double x;
  double *a_local;
  size_t count_local;
  ON_SHA1 *this_local;
  
  if ((count != 0) && (a != (double *)0x0)) {
    x = (double)a;
    a_local = (double *)count;
    count_local = (size_t)this;
    while ((ulong)x < a + count) {
      v = *(double *)x;
      local_48 = (double *)v;
      if ((v == 0.0) && (!NAN(v))) {
        local_48 = (double *)0x0;
      }
      a1 = local_48;
      x = (double)((long)x + 8);
      Internal_SwapBigEndianUpdate(this,&a1,8);
    }
  }
  return;
}

Assistant:

void ON_SHA1::AccumulateDoubleArray(
  size_t count,
  const double* a
)
{
  if (count > 0 && nullptr != a)
  {
    double x, v;
    const double* a1 = a+count;
    while( a < a1)
    {
      x = *a++;
      v = (0.0 == x ? 0.0 : x);
      Internal_SwapBigEndianUpdate( &v, sizeof(v) );
    }
  }
}